

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

void __thiscall QGuiApplicationPrivate::notifyLayoutDirectionChange(QGuiApplicationPrivate *this)

{
  undefined1 *puVar1;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QArrayData *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  if (local_28 != (undefined1 *)0x0) {
    puVar1 = (undefined1 *)0x0;
    do {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_48,ApplicationLayoutDirectionChange);
      QCoreApplication::sendEvent(*(QObject **)(puStack_30 + (long)puVar1 * 8),(QEvent *)&local_48);
      QEvent::~QEvent((QEvent *)&local_48);
      puVar1 = puVar1 + 1;
    } while (puVar1 < local_28);
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::notifyLayoutDirectionChange()
{
    const QWindowList list = QGuiApplication::topLevelWindows();
    for (int i = 0; i < list.size(); ++i) {
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(list.at(i), &ev);
    }
}